

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O2

void __thiscall VgaDebugGenerator::Run(VgaDebugGenerator *this,string *config_file)

{
  LoadConfig(this,config_file);
  LoadTemplate(this);
  ProcessConfig(this);
  ProcessModules(this,&(this->config).module_name);
  Generate(this);
  return;
}

Assistant:

void VgaDebugGenerator::Run(const std::string &config_file) {
    try {
        LoadConfig(config_file);
        LoadTemplate();
        ProcessConfig();
        ProcessModules(config.module_name);
        Generate();
    } catch (const std::string &error_msg) {
        std::cerr << error_msg << std::endl;
    }
}